

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O1

bool cppcms::xss::validate(char *begin,char *end,rules *r)

{
  data *pdVar1;
  pointer pcVar2;
  long lVar3;
  pointer peVar4;
  pointer peVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  size_t dummy_count;
  string enc;
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  parsed;
  string temp_input;
  size_t local_a0;
  string local_98;
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  local_78;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  pdVar1 = (r->d).ptr_;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar2 = (pdVar1->encoding)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + (pdVar1->encoding)._M_string_length);
  local_a0 = 0;
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = '\0';
  if (local_98._M_string_length != 0) {
    bVar6 = encoding::is_ascii_compatible(&local_98);
    if (bVar6) {
      bVar6 = encoding::valid(&local_98,begin,end,&local_a0);
    }
    else {
      booster::locale::conv::to_utf<char>
                ((char *)&local_78,begin,(string *)end,(method_type)&local_98);
      std::__cxx11::string::swap((string *)&local_50);
      begin = local_50;
      end = local_50 + local_48;
      if (local_78.
          super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_78.
                    super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_78.
                        super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar6 = encoding::valid("UTF-8",begin,end,&local_a0);
    }
    if (bVar6 == false) {
      bVar6 = false;
      goto LAB_00220f6e;
    }
  }
  local_78.
  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  anon_unknown_8::split_to_parts(begin,end,&local_78);
  peVar5 = local_78.
           super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  peVar4 = local_78.
           super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = ((long)local_78.
                  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_78.
                  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  if (local_78.
      super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_78.
      super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar9 = 0;
    uVar10 = 1;
    do {
      if ((peVar4[uVar9].type == invalid_data) ||
         (anon_unknown_8::parse_part(peVar4 + uVar9), peVar4[uVar9].type == invalid_data)) {
        bVar6 = false;
        goto LAB_00220f53;
      }
      bVar6 = uVar10 <= uVar11;
      lVar3 = uVar11 - uVar10;
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar6 && lVar3 != 0);
  }
  anon_unknown_8::validate_nesting(&local_78,((r->d).ptr_)->is_xhtml);
  if (peVar5 != peVar4) {
    uVar9 = 1;
    uVar10 = 0;
    do {
      uVar8 = uVar9;
      if (peVar4[uVar10].type == invalid_data) {
        bVar6 = false;
        goto LAB_00220f53;
      }
      uVar9 = (ulong)((int)uVar8 + 1);
      uVar10 = uVar8;
    } while (uVar8 <= uVar11 && uVar11 - uVar8 != 0);
  }
  bVar6 = peVar5 == peVar4;
  if (!bVar6) {
    uVar9 = 0;
    uVar10 = 1;
    do {
      bVar7 = anon_unknown_8::validate_entry_by_rules(peVar4 + uVar9,r);
      if (!bVar7) break;
      bVar7 = uVar11 < uVar10;
      bVar12 = uVar11 - uVar10 == 0;
      bVar6 = bVar7 || bVar12;
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (!bVar7 && !bVar12);
  }
LAB_00220f53:
  std::
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ::~vector(&local_78);
LAB_00220f6e:
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return bVar6;
}

Assistant:

bool validate(char const *begin,char const *end,rules const &r)
	{
		std::string enc = r.encoding();
		size_t dummy_count = 0;
		
		std::string temp_input;

		if(!enc.empty()) {
			if(encoding::is_ascii_compatible(enc)) {
				if(!encoding::valid(enc,begin,end,dummy_count))
					return false;
			}
			else {
				try {
					std::string tmp = 
						booster::locale::conv::to_utf<char>(
							begin,end,enc,booster::locale::conv::stop);
					temp_input.swap(tmp);
					begin = temp_input.c_str();
					end = begin + temp_input.size();
				}
				catch(...) {
					return false;
				}
				if(!encoding::valid("UTF-8",begin,end,dummy_count))
					return false;
			}
		}
		
		std::vector<entry> parsed;
		
		split_to_parts(begin,end,parsed);

		size_t size = parsed.size();

		for(unsigned i=0;i<size;i++) {
			if(parsed[i].type == invalid_data)
				return false;
			parse_part(parsed[i]);
			if(parsed[i].type == invalid_data)
				return false;
		}
		
		validate_nesting(parsed,r.html() == rules::xhtml_input);

		for(unsigned i=0;i<size;i++)
			if(parsed[i].type == invalid_data)
				return false;

		for(unsigned i=0;i<size;i++) {
			if(!validate_entry_by_rules(parsed[i],r))
				return false;
		}

		return true;

	}